

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O2

void __thiscall spdlog::logger::logger(logger *this,string *logger_name,sinks_init_list sinks_list)

{
  iterator local_50;
  iterator local_48;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)logger_name);
  local_50 = sinks_list._M_array + sinks_list._M_len;
  local_48 = sinks_list._M_array;
  logger<std::shared_ptr<spdlog::sinks::sink>const*>(this,&local_40,&local_48,&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

inline spdlog::logger::logger(const std::string &logger_name, sinks_init_list sinks_list)
    : logger(logger_name, sinks_list.begin(), sinks_list.end())
{
}